

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFilteringTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles3::Functional::Texture3DFilteringCase::iterate(Texture3DFilteringCase *this)

{
  size_type *psVar1;
  size_t *psVar2;
  ulong uVar3;
  ostringstream *poVar4;
  deUint32 dVar5;
  TestLog *log;
  Texture3D *pTVar6;
  RenderContext *context;
  pointer pFVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool bVar10;
  int iVar11;
  deUint32 dVar12;
  SamplerType SVar13;
  undefined4 extraout_var;
  RenderTarget *pRVar15;
  undefined8 *puVar16;
  NotSupportedError *this_00;
  byte bVar17;
  char *description;
  qpTestResult testResult;
  ulong uVar18;
  TestContext *pTVar19;
  uint uVar20;
  void *pvVar21;
  pointer pFVar22;
  float fVar23;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  RandomViewport viewport;
  Surface rendered;
  undefined8 *local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  LookupPrecision local_3a8;
  float local_370;
  float local_36c;
  PixelFormat pixelFormat;
  ulong local_358 [3];
  Texture3DView local_340;
  ScopedLogSection section;
  IVec4 colorBits;
  ulong local_318 [2];
  LodPrecision local_304;
  float local_2f8;
  float fStack_2f4;
  undefined1 local_2e8 [16];
  TextureFormat texFmt;
  undefined1 local_2d0 [76];
  int aiStack_284 [4];
  int aiStack_274 [2];
  int local_26c;
  anon_union_16_3_1194ccdc_for_v local_268;
  undefined8 local_258;
  LodMode local_250;
  undefined1 local_238 [16];
  int iStack_220;
  int iStack_21c;
  float local_218;
  float fStack_214;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined1 local_1f8 [112];
  ios_base local_188 [8];
  ios_base local_180 [272];
  TextureFormatInfo fmtInfo;
  long lVar14;
  
  iVar11 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar14 = CONCAT44(extraout_var,iVar11);
  pRVar15 = Context::getRenderTarget((this->super_TestCase).m_context);
  dVar12 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p
                       );
  uVar20 = ((uint)this->m_caseNdx >> 0x10 ^ this->m_caseNdx ^ 0x3d) * 9;
  uVar20 = (uVar20 >> 4 ^ uVar20) * 0x27d4eb2d;
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,pRVar15,0x40,0x40,uVar20 >> 0xf ^ dVar12 ^ uVar20);
  iVar11 = this->m_caseNdx;
  pFVar22 = (this->m_cases).
            super__Vector_base<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>_>
            ._M_impl.super__Vector_impl_data._M_start;
  texFmt = ((pFVar22[iVar11].texture)->m_refTexture).super_TextureLevelPyramid.m_format;
  tcu::getTextureFormatInfo(&fmtInfo,&texFmt);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_3d8 = &local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"Test","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
  std::ostream::operator<<(local_1f8,this->m_caseNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
  std::ios_base::~ios_base(local_188);
  uVar3 = CONCAT44(local_3a8.uvwBits.m_data[0],local_3a8.coordBits.m_data[2]) + uStack_3d0;
  uVar18 = 0xf;
  if (local_3d8 != &local_3c8) {
    uVar18 = local_3c8;
  }
  if (uVar18 < uVar3) {
    uVar18 = 0xf;
    if ((int *)local_3a8.coordBits.m_data._0_8_ != local_3a8.uvwBits.m_data + 1) {
      uVar18 = CONCAT44(local_3a8.uvwBits.m_data[2],local_3a8.uvwBits.m_data[1]);
    }
    if (uVar18 < uVar3) goto LAB_0050b164;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_3a8,0,(char *)0x0,(ulong)local_3d8);
  }
  else {
LAB_0050b164:
    puVar16 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_3d8,local_3a8.coordBits.m_data._0_8_);
  }
  local_2d0._0_8_ = local_2d0 + 0x10;
  psVar1 = puVar16 + 2;
  if ((size_type *)*puVar16 == psVar1) {
    local_2d0._16_8_ = *psVar1;
    local_2d0._24_8_ = puVar16[3];
  }
  else {
    local_2d0._16_8_ = *psVar1;
    local_2d0._0_8_ = (size_type *)*puVar16;
  }
  local_2d0._8_8_ = puVar16[1];
  *puVar16 = psVar1;
  puVar16[1] = 0;
  *(undefined1 *)psVar1 = 0;
  pixelFormat._0_8_ = local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)&pixelFormat,"Test ","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
  std::ostream::operator<<(local_1f8,this->m_caseNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
  std::ios_base::~ios_base(local_188);
  uVar3 = CONCAT44(colorBits.m_data[3],colorBits.m_data[2]) + pixelFormat._8_8_;
  uVar18 = 0xf;
  if ((ulong *)pixelFormat._0_8_ != local_358) {
    uVar18 = local_358[0];
  }
  if (uVar18 < uVar3) {
    uVar18 = 0xf;
    if ((ulong *)CONCAT44(colorBits.m_data[1],colorBits.m_data[0]) != local_318) {
      uVar18 = local_318[0];
    }
    if (uVar18 < uVar3) goto LAB_0050b2a8;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&colorBits,0,(char *)0x0,pixelFormat._0_8_);
  }
  else {
LAB_0050b2a8:
    puVar16 = (undefined8 *)
              std::__cxx11::string::_M_append
                        ((char *)&pixelFormat,CONCAT44(colorBits.m_data[1],colorBits.m_data[0]));
  }
  rendered._0_8_ = &rendered.m_pixels.m_cap;
  psVar2 = puVar16 + 2;
  if ((size_t *)*puVar16 == psVar2) {
    rendered.m_pixels.m_cap = *psVar2;
  }
  else {
    rendered.m_pixels.m_cap = *psVar2;
    rendered._0_8_ = (size_t *)*puVar16;
  }
  rendered.m_pixels.m_ptr = (void *)puVar16[1];
  *puVar16 = psVar2;
  puVar16[1] = 0;
  *(undefined1 *)psVar2 = 0;
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)local_2d0,(string *)&rendered);
  if ((size_t *)rendered._0_8_ != &rendered.m_pixels.m_cap) {
    operator_delete((void *)rendered._0_8_,rendered.m_pixels.m_cap + 1);
  }
  if ((ulong *)CONCAT44(colorBits.m_data[1],colorBits.m_data[0]) != local_318) {
    operator_delete((ulong *)CONCAT44(colorBits.m_data[1],colorBits.m_data[0]),local_318[0] + 1);
  }
  if ((ulong *)pixelFormat._0_8_ != local_358) {
    operator_delete((void *)pixelFormat._0_8_,local_358[0] + 1);
  }
  if ((undefined1 *)local_2d0._0_8_ != local_2d0 + 0x10) {
    operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
  }
  if ((int *)local_3a8.coordBits.m_data._0_8_ != local_3a8.uvwBits.m_data + 1) {
    operator_delete((void *)local_3a8.coordBits.m_data._0_8_,
                    CONCAT44(local_3a8.uvwBits.m_data[2],local_3a8.uvwBits.m_data[1]) + 1);
  }
  if (local_3d8 != &local_3c8) {
    operator_delete(local_3d8,local_3c8 + 1);
  }
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_2d0,TEXTURETYPE_3D);
  tcu::Surface::Surface(&rendered,viewport.width,viewport.height);
  local_3b8 = 0.0;
  fStack_3b4 = 0.0;
  fStack_3b0 = 0.0;
  fStack_3ac = 0.0;
  local_3c8 = 0;
  uStack_3c0 = 0;
  local_3d8 = (undefined8 *)0x0;
  uStack_3d0 = 0;
  if ((viewport.width < 0x40) || (viewport.height < 0x40)) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Too small render target","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureFilteringTests.cpp"
               ,0x437);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  glu::mapGLSampler((Sampler *)local_1f8,this->m_wrapS,this->m_wrapT,this->m_wrapR,this->m_minFilter
                    ,this->m_magFilter);
  local_26c = local_1f8._32_4_;
  aiStack_284[2] = local_1f8._16_4_;
  aiStack_284[3] = local_1f8._20_4_;
  aiStack_274[0] = local_1f8._24_4_;
  aiStack_274[1] = local_1f8._28_4_;
  local_2d0._68_8_ = local_1f8._0_8_;
  aiStack_284[0] = local_1f8._8_4_;
  aiStack_284[1] = local_1f8._12_4_;
  local_268._0_8_ = local_1f8._36_8_;
  local_268._8_8_ = local_1f8._44_8_;
  local_258 = local_1f8._52_8_;
  SVar13 = glu::TextureTestUtil::getSamplerType(texFmt);
  local_2d0._4_4_ = SVar13;
  local_250 = LODMODE_EXACT;
  local_2d0._52_4_ = fmtInfo.lookupBias.m_data[0];
  local_2d0._56_4_ = fmtInfo.lookupBias.m_data[1];
  local_2d0._60_4_ = fmtInfo.lookupBias.m_data[2];
  local_2d0._64_4_ = fmtInfo.lookupBias.m_data[3];
  local_2d0._36_4_ = fmtInfo.lookupScale.m_data[0];
  local_2d0._40_4_ = fmtInfo.lookupScale.m_data[1];
  local_2d0._44_4_ = fmtInfo.lookupScale.m_data[2];
  local_2d0._48_4_ = fmtInfo.lookupScale.m_data[3];
  local_1f8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar4 = (ostringstream *)(local_1f8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar4,"Approximate lod per axis = ",0x1b);
  pFVar22 = pFVar22 + iVar11;
  tcu::operator<<((ostream *)poVar4,&pFVar22->lod);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,", offset = ",0xb);
  tcu::operator<<((ostream *)poVar4,&pFVar22->offset);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar4);
  std::ios_base::~ios_base(local_180);
  local_36c = (pFVar22->offset).m_data[2];
  local_2f8 = (pFVar22->lod).m_data[1] * 0.6931472;
  local_370 = (pFVar22->lod).m_data[2] * 0.6931472;
  local_218 = expf((pFVar22->lod).m_data[0] * 0.6931472);
  pTVar6 = this->m_gradientTex;
  local_208 = *(undefined8 **)(pFVar22->offset).m_data;
  uStack_200 = 0;
  iStack_220 = viewport.width;
  iStack_21c = viewport.height;
  local_2e8 = ZEXT416((uint)(pTVar6->m_refTexture).m_width);
  fStack_214 = extraout_XMM0_Db;
  local_2f8 = expf(local_2f8);
  local_238 = ZEXT416((uint)viewport.height);
  auVar27._4_4_ = (pTVar6->m_refTexture).m_height;
  auVar27._0_4_ = local_2e8._0_4_;
  auVar27._8_4_ = local_2e8._4_4_;
  auVar27._12_4_ = 0;
  fStack_2f4 = extraout_XMM0_Db_00;
  local_2e8 = auVar27;
  fVar23 = expf(local_370);
  auVar26._0_4_ = local_218 * (float)iStack_220;
  auVar26._4_4_ = local_2f8 * (float)(int)local_238._0_4_;
  auVar26._8_4_ = fStack_214 * (float)iStack_220;
  auVar26._12_4_ = fStack_2f4 * (float)iStack_21c;
  auVar25._0_4_ = (float)(int)local_2e8._0_4_;
  auVar25._4_4_ = (float)(int)local_2e8._4_4_;
  auVar25._8_4_ = (float)(int)local_2e8._8_4_;
  auVar25._12_4_ = (float)(int)local_2e8._12_4_;
  auVar27 = divps(auVar26,auVar25);
  iVar11 = viewport.height;
  if (viewport.height < viewport.width) {
    iVar11 = viewport.width;
  }
  fStack_3ac = ((float)iVar11 * fVar23) / (float)(pTVar6->m_refTexture).m_depth;
  local_3d8 = local_208;
  local_3b8 = fStack_3ac * 0.5 + local_36c;
  uStack_3d0 = CONCAT44((float)local_208,local_36c);
  fStack_3b4 = auVar27._0_4_ + (float)local_208;
  fStack_3b0 = auVar27._4_4_ + local_208._4_4_;
  local_3c8 = CONCAT44(local_3b8,fStack_3b0);
  uStack_3c0 = CONCAT44(local_208._4_4_,fStack_3b4);
  fStack_3ac = fStack_3ac + local_36c;
  (**(code **)(lVar14 + 0xb8))(0x806f,pFVar22->texture->m_glTexture);
  (**(code **)(lVar14 + 0x1360))(0x806f,0x2801,this->m_minFilter);
  (**(code **)(lVar14 + 0x1360))(0x806f,0x2800,this->m_magFilter);
  (**(code **)(lVar14 + 0x1360))(0x806f,0x2802,this->m_wrapS);
  (**(code **)(lVar14 + 0x1360))(0x806f,0x2803,this->m_wrapT);
  (**(code **)(lVar14 + 0x1360))(0x806f,0x8072,this->m_wrapR);
  (**(code **)(lVar14 + 0x1a00))(viewport.x,viewport.y,viewport.width,viewport.height);
  deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
            (&this->m_renderer,0,(float *)&local_3d8,(RenderParams *)local_2d0);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_3a8.coordBits.m_data[0] = 8;
  local_3a8.coordBits.m_data[1] = 3;
  pvVar21 = (void *)rendered.m_pixels.m_cap;
  if (rendered.m_pixels.m_cap != 0) {
    pvVar21 = rendered.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1f8,(TextureFormat *)&local_3a8,rendered.m_width,
             rendered.m_height,1,pvVar21);
  glu::readPixels(context,viewport.x,viewport.y,(PixelBufferAccess *)local_1f8);
  dVar12 = this->m_minFilter;
  dVar5 = this->m_magFilter;
  pRVar15 = Context::getRenderTarget((this->super_TestCase).m_context);
  uVar20 = (dVar5 == 0x2600 && dVar12 == 0x2600) | 0xfffffffe;
  pixelFormat.redBits = (pRVar15->m_pixelFormat).redBits;
  pixelFormat.greenBits = (pRVar15->m_pixelFormat).greenBits;
  pixelFormat.blueBits = (pRVar15->m_pixelFormat).blueBits;
  pixelFormat.alphaBits = (pRVar15->m_pixelFormat).alphaBits;
  colorBits.m_data[0] =
       -(uint)(0 < (int)(uVar20 + pixelFormat.redBits)) & uVar20 + pixelFormat.redBits;
  colorBits.m_data[1] =
       -(uint)(0 < (int)(uVar20 + pixelFormat.greenBits)) & uVar20 + pixelFormat.greenBits;
  colorBits.m_data[2] =
       -(uint)(0 < (int)(uVar20 + pixelFormat.blueBits)) & uVar20 + pixelFormat.blueBits;
  colorBits.m_data[3] =
       -(uint)(0 < (int)(uVar20 + pixelFormat.alphaBits)) & uVar20 + pixelFormat.alphaBits;
  local_304.rule = RULE_OPENGL;
  local_304.derivateBits = 0x12;
  local_3a8.coordBits.m_data[0] = 0x16;
  local_3a8.coordBits.m_data[1] = 0x16;
  local_3a8.coordBits.m_data[2] = 0x16;
  local_3a8.uvwBits.m_data[0] = 0x10;
  local_3a8.uvwBits.m_data[1] = 0x10;
  local_3a8.uvwBits.m_data[2] = 0x10;
  local_3a8.colorThreshold.m_data = (float  [4])ZEXT816(0);
  local_3a8.colorMask.m_data[0] = true;
  local_3a8.colorMask.m_data[1] = true;
  local_3a8.colorMask.m_data[2] = true;
  local_3a8.colorMask.m_data[3] = true;
  local_304.lodBits = 6;
  tcu::computeFixedPointThreshold((tcu *)local_1f8,&colorBits);
  auVar9._8_8_ = local_1f8._8_8_;
  auVar9._0_8_ = local_1f8._0_8_;
  auVar8._8_8_ = local_2d0._44_8_;
  auVar8._0_8_ = local_2d0._36_8_;
  local_3a8.colorThreshold.m_data = (float  [4])divps(auVar9,auVar8);
  local_3a8.coordBits.m_data[0] = 0x14;
  local_3a8.coordBits.m_data[1] = 0x14;
  local_3a8.coordBits.m_data[2] = 0x14;
  local_3a8.uvwBits.m_data[0] = 7;
  local_3a8.uvwBits.m_data[1] = 7;
  local_3a8.uvwBits.m_data[2] = 7;
  auVar24._0_4_ = -(uint)(0 < pixelFormat.redBits);
  auVar24._4_4_ = -(uint)(0 < pixelFormat.greenBits);
  auVar24._8_4_ = -(uint)(0 < pixelFormat.blueBits);
  auVar24._12_4_ = -(uint)(0 < pixelFormat.alphaBits);
  uVar20 = movmskps(7,auVar24);
  bVar17 = (byte)uVar20;
  local_3a8.colorMask.m_data =
       (bool  [4])
       (uVar20 & 1 | (uint)((bVar17 & 2) >> 1) << 8 | (uint)((bVar17 & 4) >> 2) << 0x10 |
       (uint)(bVar17 >> 3) << 0x18);
  pTVar19 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  local_340.m_numLevels = 8;
  local_340._4_4_ = 3;
  pvVar21 = (void *)rendered.m_pixels.m_cap;
  if (rendered.m_pixels.m_cap != 0) {
    pvVar21 = rendered.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1f8,(TextureFormat *)&local_340,rendered.m_width,
             rendered.m_height,1,pvVar21);
  local_340.m_levels = (pFVar22->texture->m_refTexture).m_view.m_levels;
  local_340.m_numLevels = (pFVar22->texture->m_refTexture).m_view.m_numLevels;
  bVar10 = glu::TextureTestUtil::verifyTextureResult
                     (pTVar19,(ConstPixelBufferAccess *)local_1f8,&local_340,(float *)&local_3d8,
                      (ReferenceParams *)local_2d0,&local_3a8,&local_304,&pixelFormat);
  if (!bVar10) {
    local_304.lodBits = 4;
    local_3a8.uvwBits.m_data[0] = 4;
    local_3a8.uvwBits.m_data[1] = 4;
    local_3a8.uvwBits.m_data[2] = 4;
    local_1f8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar4 = (ostringstream *)(local_1f8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar4,
               "Warning: Verification against high precision requirements failed, trying with lower requirements."
               ,0x61);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    std::ios_base::~ios_base(local_180);
    pTVar19 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    local_340.m_numLevels = 8;
    local_340._4_4_ = 3;
    pvVar21 = (void *)rendered.m_pixels.m_cap;
    if (rendered.m_pixels.m_cap != 0) {
      pvVar21 = rendered.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1f8,(TextureFormat *)&local_340,rendered.m_width,
               rendered.m_height,1,pvVar21);
    local_340.m_levels = (pFVar22->texture->m_refTexture).m_view.m_levels;
    local_340.m_numLevels = (pFVar22->texture->m_refTexture).m_view.m_numLevels;
    bVar10 = glu::TextureTestUtil::verifyTextureResult
                       (pTVar19,(ConstPixelBufferAccess *)local_1f8,&local_340,(float *)&local_3d8,
                        (ReferenceParams *)local_2d0,&local_3a8,&local_304,&pixelFormat);
    if (bVar10) {
      pTVar19 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      if (pTVar19->m_testResult != QP_TEST_RESULT_PASS) goto LAB_0050bb78;
      description = "Low-quality filtering result";
      testResult = QP_TEST_RESULT_QUALITY_WARNING;
    }
    else {
      local_1f8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar4 = (ostringstream *)(local_1f8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar4,
                 "ERROR: Verification against low precision requirements failed, failing test case."
                 ,0x51);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar4);
      std::ios_base::~ios_base(local_180);
      pTVar19 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      description = "Image verification failed";
      testResult = QP_TEST_RESULT_FAIL;
    }
    tcu::TestContext::setTestResult(pTVar19,testResult,description);
  }
LAB_0050bb78:
  iVar11 = this->m_caseNdx + 1;
  this->m_caseNdx = iVar11;
  pFVar22 = (this->m_cases).
            super__Vector_base<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pFVar7 = (this->m_cases).
           super__Vector_base<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  tcu::Surface::~Surface(&rendered);
  tcu::TestLog::endSection(section.m_log);
  return (IterateResult)(iVar11 < (int)((ulong)((long)pFVar7 - (long)pFVar22) >> 5));
}

Assistant:

Texture3DFilteringCase::IterateResult Texture3DFilteringCase::iterate (void)
{
	const glw::Functions&			gl			= m_context.getRenderContext().getFunctions();
	const RandomViewport			viewport	(m_context.getRenderTarget(), TEX3D_VIEWPORT_WIDTH, TEX3D_VIEWPORT_HEIGHT, deStringHash(getName()) ^ deInt32Hash(m_caseNdx));
	const FilterCase&				curCase		= m_cases[m_caseNdx];
	const tcu::TextureFormat		texFmt		= curCase.texture->getRefTexture().getFormat();
	const tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(texFmt);
	const tcu::ScopedLogSection		section		(m_testCtx.getLog(), string("Test") + de::toString(m_caseNdx), string("Test ") + de::toString(m_caseNdx));
	ReferenceParams					refParams	(TEXTURETYPE_3D);
	tcu::Surface					rendered	(viewport.width, viewport.height);
	tcu::Vec3						texCoord[4];

	if (viewport.width < TEX3D_MIN_VIEWPORT_WIDTH || viewport.height < TEX3D_MIN_VIEWPORT_HEIGHT)
		throw tcu::NotSupportedError("Too small render target", "", __FILE__, __LINE__);

	// Setup params for reference.
	refParams.sampler		= glu::mapGLSampler(m_wrapS, m_wrapT, m_wrapR, m_minFilter, m_magFilter);
	refParams.samplerType	= getSamplerType(texFmt);
	refParams.lodMode		= LODMODE_EXACT;
	refParams.colorBias		= fmtInfo.lookupBias;
	refParams.colorScale	= fmtInfo.lookupScale;

	// Compute texture coordinates.
	m_testCtx.getLog() << TestLog::Message << "Approximate lod per axis = " << curCase.lod << ", offset = " << curCase.offset << TestLog::EndMessage;

	{
		const float	lodX	= curCase.lod.x();
		const float	lodY	= curCase.lod.y();
		const float	lodZ	= curCase.lod.z();
		const float	oX		= curCase.offset.x();
		const float	oY		= curCase.offset.y();
		const float oZ		= curCase.offset.z();
		const float	sX		= deFloatExp2(lodX)*float(viewport.width)							/ float(m_gradientTex->getRefTexture().getWidth());
		const float	sY		= deFloatExp2(lodY)*float(viewport.height)							/ float(m_gradientTex->getRefTexture().getHeight());
		const float	sZ		= deFloatExp2(lodZ)*float(de::max(viewport.width, viewport.height))	/ float(m_gradientTex->getRefTexture().getDepth());

		texCoord[0] = tcu::Vec3(oX,		oY,		oZ);
		texCoord[1] = tcu::Vec3(oX,		oY+sY,	oZ + sZ*0.5f);
		texCoord[2] = tcu::Vec3(oX+sX,	oY,		oZ + sZ*0.5f);
		texCoord[3] = tcu::Vec3(oX+sX,	oY+sY,	oZ + sZ);
	}

	gl.bindTexture	(GL_TEXTURE_3D, curCase.texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAG_FILTER,	m_magFilter);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_T,		m_wrapT);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_R,		m_wrapR);

	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);
	m_renderer.renderQuad(0, (const float*)&texCoord[0], refParams);
	glu::readPixels(m_context.getRenderContext(), viewport.x, viewport.y, rendered.getAccess());

	{
		const bool				isNearestOnly	= m_minFilter == GL_NEAREST && m_magFilter == GL_NEAREST;
		const tcu::PixelFormat	pixelFormat		= m_context.getRenderTarget().getPixelFormat();
		const tcu::IVec4		colorBits		= max(getBitsVec(pixelFormat) - (isNearestOnly ? 1 : 2), tcu::IVec4(0)); // 1 inaccurate bit if nearest only, 2 otherwise
		tcu::LodPrecision		lodPrecision	(tcu::LodPrecision::RULE_OPENGL);
		tcu::LookupPrecision	lookupPrecision;

		lodPrecision.derivateBits		= 18;
		lodPrecision.lodBits			= 6;
		lookupPrecision.colorThreshold	= tcu::computeFixedPointThreshold(colorBits) / refParams.colorScale;
		lookupPrecision.coordBits		= tcu::IVec3(20,20,20);
		lookupPrecision.uvwBits			= tcu::IVec3(7,7,7);
		lookupPrecision.colorMask		= getCompareMask(pixelFormat);

		const bool isHighQuality = verifyTextureResult(m_testCtx, rendered.getAccess(), curCase.texture->getRefTexture(),
													   (const float*)&texCoord[0], refParams, lookupPrecision, lodPrecision, pixelFormat);

		if (!isHighQuality)
		{
			// Evaluate against lower precision requirements.
			lodPrecision.lodBits	= 4;
			lookupPrecision.uvwBits	= tcu::IVec3(4,4,4);

			m_testCtx.getLog() << TestLog::Message << "Warning: Verification against high precision requirements failed, trying with lower requirements." << TestLog::EndMessage;

			const bool isOk = verifyTextureResult(m_testCtx, rendered.getAccess(), curCase.texture->getRefTexture(),
												  (const float*)&texCoord[0], refParams, lookupPrecision, lodPrecision, pixelFormat);

			if (!isOk)
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: Verification against low precision requirements failed, failing test case." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
			}
			else if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
				m_testCtx.setTestResult(QP_TEST_RESULT_QUALITY_WARNING, "Low-quality filtering result");
		}
	}

	m_caseNdx += 1;
	return m_caseNdx < (int)m_cases.size() ? CONTINUE : STOP;
}